

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void analyzeTable(Parse *pParse,Table *pTab,Index *pOnlyIdx)

{
  int iStatCur;
  int iVar1;
  Schema *pSVar2;
  Schema **ppSVar3;
  int iDb;
  int iTab;
  
  if (pTab->pSchema == (Schema *)0x0) {
    iDb = -0x8000;
  }
  else {
    iDb = -1;
    ppSVar3 = &pParse->db->aDb->pSchema;
    do {
      iDb = iDb + 1;
      pSVar2 = *ppSVar3;
      ppSVar3 = ppSVar3 + 4;
    } while (pSVar2 != pTab->pSchema);
  }
  sqlite3BeginWriteOperation(pParse,0,iDb);
  iStatCur = pParse->nTab;
  pParse->nTab = iStatCur + 3;
  if (pOnlyIdx == (Index *)0x0) {
    openStatTable(pParse,iDb,iStatCur,pTab->zName,"tbl");
    iTab = pParse->nTab;
    iVar1 = pParse->nMem;
    pOnlyIdx = (Index *)0x0;
  }
  else {
    openStatTable(pParse,iDb,iStatCur,pOnlyIdx->zName,"idx");
    iTab = pParse->nTab;
    iVar1 = pParse->nMem;
  }
  analyzeOneTable(pParse,pTab,pOnlyIdx,iStatCur,iVar1 + 1,iTab);
  loadAnalysis(pParse,iDb);
  return;
}

Assistant:

static void analyzeTable(Parse *pParse, Table *pTab, Index *pOnlyIdx){
  int iDb;
  int iStatCur;

  assert( pTab!=0 );
  assert( sqlite3BtreeHoldsAllMutexes(pParse->db) );
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  sqlite3BeginWriteOperation(pParse, 0, iDb);
  iStatCur = pParse->nTab;
  pParse->nTab += 3;
  if( pOnlyIdx ){
    openStatTable(pParse, iDb, iStatCur, pOnlyIdx->zName, "idx");
  }else{
    openStatTable(pParse, iDb, iStatCur, pTab->zName, "tbl");
  }
  analyzeOneTable(pParse, pTab, pOnlyIdx, iStatCur,pParse->nMem+1,pParse->nTab);
  loadAnalysis(pParse, iDb);
}